

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string root;
  path local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  root_path(&local_60,this);
  paVar2 = &local_60._path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._path._M_dataplus._M_p == paVar2) {
    local_30._8_8_ = local_60._path.field_2._8_8_;
    local_40 = &local_30;
  }
  else {
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60._path._M_dataplus._M_p;
  }
  local_30._M_allocated_capacity._1_7_ = local_60._path.field_2._M_allocated_capacity._1_7_;
  local_30._M_local_buf[0] = local_60._path.field_2._M_local_buf[0];
  local_38 = local_60._path._M_string_length;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._path._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_60._path.field_2._M_allocated_capacity._1_7_,
                  local_60._path.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) =
         local_60._path.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = local_60._path._M_dataplus._M_p;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
         CONCAT71(local_60._path.field_2._M_allocated_capacity._1_7_,
                  local_60._path.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->_path)._M_string_length = local_60._path._M_string_length;
  local_60._path._M_string_length = 0;
  local_60._path.field_2._M_local_buf[0] = '\0';
  local_60._path._M_dataplus._M_p = (pointer)paVar2;
  postprocess_path_with_format(&__return_storage_ptr__->_path,(format)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._path._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._path._M_dataplus._M_p,
                    CONCAT71(local_60._path.field_2._M_allocated_capacity._1_7_,
                             local_60._path.field_2._M_local_buf[0]) + 1);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    std::string root = root_path()._path;
    return path(_path.substr((std::min)(root.length(), _path.length())), generic_format);
}